

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O0

int scalar_from_cbs(CBS *cbs,EC_GROUP *group,EC_SCALAR *out)

{
  uint uVar1;
  int iVar2;
  BIGNUM *bn;
  uint8_t *in;
  size_t len;
  undefined1 local_40 [8];
  CBS tmp;
  size_t scalar_len;
  EC_SCALAR *out_local;
  EC_GROUP *group_local;
  CBS *cbs_local;
  
  bn = EC_GROUP_get0_order(group);
  uVar1 = BN_num_bytes(bn);
  tmp.len = (size_t)uVar1;
  iVar2 = CBS_get_bytes(cbs,(CBS *)local_40,tmp.len);
  if (iVar2 != 0) {
    in = CBS_data((CBS *)local_40);
    len = CBS_len((CBS *)local_40);
    ec_scalar_from_bytes(group,out,in,len);
  }
  else {
    ERR_put_error(0x20,0,0x69,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/pmbtoken.cc"
                  ,0x191);
  }
  cbs_local._4_4_ = (uint)(iVar2 != 0);
  return cbs_local._4_4_;
}

Assistant:

static int scalar_from_cbs(CBS *cbs, const EC_GROUP *group, EC_SCALAR *out) {
  size_t scalar_len = BN_num_bytes(EC_GROUP_get0_order(group));
  CBS tmp;
  if (!CBS_get_bytes(cbs, &tmp, scalar_len)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_FAILURE);
    return 0;
  }

  ec_scalar_from_bytes(group, out, CBS_data(&tmp), CBS_len(&tmp));
  return 1;
}